

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int iColumn)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  JsonEachCursor *p_00;
  uint in_EDX;
  sqlite3_context *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  u32 n_1;
  u64 nBase;
  u32 i_2;
  u32 in_stack_00000024;
  u8 eType;
  u32 i_1;
  u32 i;
  u32 j;
  u32 n;
  JsonEachCursor *p;
  i64 x;
  _func_void_void_ptr *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  JsonEachCursor *in_stack_ffffffffffffffb0;
  JsonEachCursor *p_01;
  u8 in_stack_ffffffffffffffdb;
  char *zNum;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_00 = (JsonEachCursor *)(ulong)in_EDX;
  switch(p_00) {
  case (JsonEachCursor *)0x0:
    if (*(int *)(in_RDI + 0x1c) == 0) {
      if ((*(int *)(in_RDI + 0x14) != 1) &&
         (zNum = in_RDI, uVar2 = jsonEachPathLength(in_stack_ffffffffffffffb0),
         *(uint *)(in_RDI + 0x14) != uVar2)) {
        if (*(char *)(*(long *)(in_RDI + 0x40) + (ulong)uVar2) == '[') {
          sqlite3Atoi64(zNum,(i64 *)in_RSI,in_EDX,in_stack_ffffffffffffffdb);
          sqlite3_result_int64((sqlite3_context *)p_00,(i64)in_stack_ffffffffffffff98);
        }
        else {
          iVar3 = (int)((ulong)p_00 >> 0x20);
          if (*(char *)(*(long *)(in_RDI + 0x40) + (ulong)(uVar2 + 1)) == '\"') {
            sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffffb0,
                                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ),iVar3,in_stack_ffffffffffffff98);
          }
          else {
            sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffffb0,
                                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ),iVar3,in_stack_ffffffffffffff98);
          }
        }
      }
    }
    else if (in_RDI[0x18] == '\f') {
      jsonReturnFromBlob(_i_1,in_stack_00000024,(sqlite3_context *)nBase,n_1);
    }
    else {
      sqlite3_result_int64((sqlite3_context *)p_00,(i64)in_stack_ffffffffffffff98);
    }
    break;
  case (JsonEachCursor *)0x1:
    uVar2 = jsonSkipLabel(p_00);
    jsonReturnFromBlob(_i_1,in_stack_00000024,(sqlite3_context *)nBase,n_1);
    if (10 < (*(byte *)(*(long *)(in_RDI + 0xc0) + (ulong)uVar2) & 0xf)) {
      sqlite3_result_subtype(in_RSI,0x4a);
    }
    break;
  case (JsonEachCursor *)0x2:
    jsonSkipLabel(p_00);
    sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffffb0,
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (int)((ulong)p_00 >> 0x20),in_stack_ffffffffffffff98);
    break;
  case (JsonEachCursor *)0x3:
    uVar2 = jsonSkipLabel(p_00);
    if ((*(byte *)(*(long *)(in_RDI + 0xc0) + (ulong)uVar2) & 0xf) < 0xb) {
      jsonReturnFromBlob(_i_1,in_stack_00000024,(sqlite3_context *)nBase,n_1);
    }
    break;
  case (JsonEachCursor *)0x4:
    sqlite3_result_int64((sqlite3_context *)p_00,(i64)in_stack_ffffffffffffff98);
    break;
  case (JsonEachCursor *)0x5:
    if ((*(int *)(in_RDI + 0x1c) != 0) && (in_RDI[0x19] != '\0')) {
      sqlite3_result_int64((sqlite3_context *)p_00,(i64)in_stack_ffffffffffffff98);
    }
    break;
  case (JsonEachCursor *)0x6:
    p_01 = *(JsonEachCursor **)(in_RDI + 0x50);
    if (*(int *)(in_RDI + 0x1c) != 0) {
      jsonAppendPathName(p_01);
    }
    sqlite3_result_text64
              ((sqlite3_context *)p_01,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (sqlite3_uint64)p_00,in_stack_ffffffffffffff98,'\0');
    *(JsonEachCursor **)(in_RDI + 0x50) = p_01;
    break;
  case (JsonEachCursor *)0x7:
    iVar3 = jsonEachPathLength(in_stack_ffffffffffffffb0);
    sqlite3_result_text64
              ((sqlite3_context *)in_stack_ffffffffffffffb0,
               (char *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),(sqlite3_uint64)p_00,
               in_stack_ffffffffffffff98,'\0');
    break;
  case (JsonEachCursor *)0x8:
    if (*(long *)(in_RDI + 0xd0) == 0) {
      sqlite3_result_blob((sqlite3_context *)in_stack_ffffffffffffffb0,
                          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                          in_stack_ffffffffffffff98);
    }
    else {
      sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffffb0,
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                          in_stack_ffffffffffffff98);
    }
    break;
  default:
    sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffffb0,
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                        in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int jsonEachColumn(
  sqlite3_vtab_cursor *cur,   /* The cursor */
  sqlite3_context *ctx,       /* First argument to sqlite3_result_...() */
  int iColumn                 /* Which column to return */
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  switch( iColumn ){
    case JEACH_KEY: {
      if( p->nParent==0 ){
        u32 n, j;
        if( p->nRoot==1 ) break;
        j = jsonEachPathLength(p);
        n = p->nRoot - j;
        if( n==0 ){
          break;
        }else if( p->path.zBuf[j]=='[' ){
          i64 x;
          sqlite3Atoi64(&p->path.zBuf[j+1], &x, n-1, SQLITE_UTF8);
          sqlite3_result_int64(ctx, x);
        }else if( p->path.zBuf[j+1]=='"' ){
          sqlite3_result_text(ctx, &p->path.zBuf[j+2], n-3, SQLITE_TRANSIENT);
        }else{
          sqlite3_result_text(ctx, &p->path.zBuf[j+1], n-1, SQLITE_TRANSIENT);
        }
        break;
      }
      if( p->eType==JSONB_OBJECT ){
        jsonReturnFromBlob(&p->sParse, p->i, ctx, 1);
      }else{
        assert( p->eType==JSONB_ARRAY );
        sqlite3_result_int64(ctx, p->aParent[p->nParent-1].iKey);
      }
      break;
    }
    case JEACH_VALUE: {
      u32 i = jsonSkipLabel(p);
      jsonReturnFromBlob(&p->sParse, i, ctx, 1);
      if( (p->sParse.aBlob[i] & 0x0f)>=JSONB_ARRAY ){
        sqlite3_result_subtype(ctx, JSON_SUBTYPE);
      }
      break;
    }
    case JEACH_TYPE: {
      u32 i = jsonSkipLabel(p);
      u8 eType = p->sParse.aBlob[i] & 0x0f;
      sqlite3_result_text(ctx, jsonbType[eType], -1, SQLITE_STATIC);
      break;
    }
    case JEACH_ATOM: {
      u32 i = jsonSkipLabel(p);
      if( (p->sParse.aBlob[i] & 0x0f)<JSONB_ARRAY ){
        jsonReturnFromBlob(&p->sParse, i, ctx, 1);
      }
      break;
    }
    case JEACH_ID: {
      sqlite3_result_int64(ctx, (sqlite3_int64)p->i);
      break;
    }
    case JEACH_PARENT: {
      if( p->nParent>0 && p->bRecursive ){
        sqlite3_result_int64(ctx, p->aParent[p->nParent-1].iHead);
      }
      break;
    }
    case JEACH_FULLKEY: {
      u64 nBase = p->path.nUsed;
      if( p->nParent ) jsonAppendPathName(p);
      sqlite3_result_text64(ctx, p->path.zBuf, p->path.nUsed,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
      p->path.nUsed = nBase;
      break;
    }
    case JEACH_PATH: {
      u32 n = jsonEachPathLength(p);
      sqlite3_result_text64(ctx, p->path.zBuf, n,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
      break;
    }
    default: {
      sqlite3_result_text(ctx, p->path.zBuf, p->nRoot, SQLITE_STATIC);
      break;
    }
    case JEACH_JSON: {
      if( p->sParse.zJson==0 ){
        sqlite3_result_blob(ctx, p->sParse.aBlob, p->sParse.nBlob,
                            SQLITE_TRANSIENT);
      }else{
        sqlite3_result_text(ctx, p->sParse.zJson, -1, SQLITE_TRANSIENT);
      }
      break;
    }
  }
  return SQLITE_OK;
}